

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

CloudNode * Cloud_Support(CloudManager *dd,CloudNode *n)

{
  ulong uVar1;
  long lVar2;
  CloudNode *n_00;
  ulong uVar3;
  CloudNode *pCVar4;
  int *support;
  
  if ((n < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= n)) {
    __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x26f,"CloudNode *Cloud_Support(CloudManager *, CloudNode *)");
  }
  n_00 = (CloudNode *)calloc((long)dd->nVars,4);
  pCVar4 = n_00;
  cloudSupport((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_00,support);
  cloudClearMark((CloudManager *)((ulong)n & 0xfffffffffffffffe),pCVar4);
  pCVar4 = dd->one;
  uVar3 = (ulong)(uint)dd->nVars;
  do {
    if ((int)uVar3 < 1) goto LAB_0047bb03;
    uVar1 = uVar3 - 1;
    lVar2 = uVar3 * 4;
    uVar3 = uVar1;
  } while ((*(int *)((long)n_00 + lVar2 + -4) != 1) ||
          (pCVar4 = Cloud_bddAnd(dd,pCVar4,dd->vars[uVar1]), pCVar4 != (CloudNode *)0x0));
  pCVar4 = (CloudNode *)0x0;
LAB_0047bb03:
  free(n_00);
  return pCVar4;
}

Assistant:

CloudNode * Cloud_Support( CloudManager * dd, CloudNode * n )
{
	CloudNode * res;
	int * support, i;

	CLOUD_ASSERT(n);

	// allocate and initialize support array for cloudSupport
	support = ABC_CALLOC( int, dd->nVars );

	// compute support and clean up markers
	cloudSupport( dd, Cloud_Regular(n), support );
	cloudClearMark( dd, Cloud_Regular(n) );

	// transform support from array to cube
	res = dd->one;
	for ( i = dd->nVars - 1; i >= 0; i-- ) // for each level bottom-up 
		if ( support[i] == 1 )
		{
			res = Cloud_bddAnd( dd, res, dd->vars[i] );
			if ( res == NULL )
				break;
		}
	ABC_FREE( support );
	return res;
}